

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall capnp::DynamicValue::Pipeline::~Pipeline(Pipeline *this)

{
  Type local_1c;
  Fault f;
  
  local_1c = this->type;
  if (local_1c != UNKNOWN) {
    if (local_1c == CAPABILITY) {
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&(this->field_1).structValue);
      return;
    }
    if (local_1c == STRUCT) {
      AnyPointer::Pipeline::~Pipeline(&(this->field_1).structValue.typeless);
      return;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x692,FAILED,(char *)0x0,"\"Unexpected pipeline type.\", (uint)type",
               (char (*) [26])"Unexpected pipeline type.",&local_1c);
    this->type = UNKNOWN;
    kj::_::Debug::Fault::~Fault(&f);
  }
  return;
}

Assistant:

DynamicValue::Pipeline::~Pipeline() noexcept(false) {
  switch (type) {
    case UNKNOWN: break;
    case STRUCT: kj::dtor(structValue); break;
    case CAPABILITY: kj::dtor(capabilityValue); break;
    default:
      KJ_FAIL_ASSERT("Unexpected pipeline type.", (uint)type) { type = UNKNOWN; break; }
      break;
  }
}